

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PoolingLayerParams::MergeFrom
          (PoolingLayerParams *this,PoolingLayerParams *from)

{
  int iVar1;
  uint32 uVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  SamePadding *this_00;
  PoolingLayerParams_ValidCompletePadding *this_01;
  ValidPadding *this_02;
  SamePadding *from_00;
  PoolingLayerParams_ValidCompletePadding *from_01;
  ValidPadding *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x7f90);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->kernelsize_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->kernelsize_,iVar1 + (this->kernelsize_).current_size_);
    memcpy(((this->kernelsize_).rep_)->elements + (this->kernelsize_).current_size_,
           ((from->kernelsize_).rep_)->elements,(long)(from->kernelsize_).current_size_ << 3);
    (this->kernelsize_).current_size_ =
         (this->kernelsize_).current_size_ + (from->kernelsize_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->stride_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->stride_,iVar1 + (this->stride_).current_size_);
    memcpy(((this->stride_).rep_)->elements + (this->stride_).current_size_,
           ((from->stride_).rep_)->elements,(long)(from->stride_).current_size_ << 3);
    (this->stride_).current_size_ = (this->stride_).current_size_ + (from->stride_).current_size_;
  }
  if (from->type_ != 0) {
    this->type_ = from->type_;
  }
  if (from->avgpoolexcludepadding_ == true) {
    this->avgpoolexcludepadding_ = true;
  }
  if (from->globalpooling_ == true) {
    this->globalpooling_ = true;
  }
  uVar2 = from->_oneof_case_[0];
  if (uVar2 != 0x20) {
    if (uVar2 != 0x1f) {
      if (uVar2 != 0x1e) {
        return;
      }
      if (this->_oneof_case_[0] == 0x1e) {
        this_02 = (this->PoolingPaddingType_).valid_;
      }
      else {
        clear_PoolingPaddingType(this);
        this->_oneof_case_[0] = 0x1e;
        this_02 = (ValidPadding *)operator_new(0x20);
        ValidPadding::ValidPadding(this_02);
        (this->PoolingPaddingType_).valid_ = this_02;
        if (from->_oneof_case_[0] != 0x1e) {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_02 = (ValidPadding *)&_ValidPadding_default_instance_;
          goto LAB_001eb88f;
        }
      }
      from_02 = (from->PoolingPaddingType_).valid_;
LAB_001eb88f:
      ValidPadding::MergeFrom(this_02,from_02);
      return;
    }
    if (this->_oneof_case_[0] == 0x1f) {
      this_00 = (this->PoolingPaddingType_).same_;
    }
    else {
      clear_PoolingPaddingType(this);
      this->_oneof_case_[0] = 0x1f;
      this_00 = (SamePadding *)operator_new(0x18);
      SamePadding::SamePadding(this_00);
      (this->PoolingPaddingType_).same_ = this_00;
      if (from->_oneof_case_[0] != 0x1f) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_00 = (SamePadding *)&_SamePadding_default_instance_;
        goto LAB_001eb863;
      }
    }
    from_00 = (from->PoolingPaddingType_).same_;
LAB_001eb863:
    SamePadding::MergeFrom(this_00,from_00);
    return;
  }
  if (this->_oneof_case_[0] == 0x20) {
    this_01 = (this->PoolingPaddingType_).includelastpixel_;
  }
  else {
    clear_PoolingPaddingType(this);
    this->_oneof_case_[0] = 0x20;
    this_01 = (PoolingLayerParams_ValidCompletePadding *)operator_new(0x28);
    PoolingLayerParams_ValidCompletePadding::PoolingLayerParams_ValidCompletePadding(this_01);
    (this->PoolingPaddingType_).includelastpixel_ = this_01;
    if (from->_oneof_case_[0] != 0x20) {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (PoolingLayerParams_ValidCompletePadding *)
                &_PoolingLayerParams_ValidCompletePadding_default_instance_;
      goto LAB_001eb879;
    }
  }
  from_01 = (from->PoolingPaddingType_).includelastpixel_;
LAB_001eb879:
  PoolingLayerParams_ValidCompletePadding::MergeFrom(this_01,from_01);
  return;
}

Assistant:

void PoolingLayerParams::MergeFrom(const PoolingLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PoolingLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  kernelsize_.MergeFrom(from.kernelsize_);
  stride_.MergeFrom(from.stride_);
  if (from.type() != 0) {
    set_type(from.type());
  }
  if (from.avgpoolexcludepadding() != 0) {
    set_avgpoolexcludepadding(from.avgpoolexcludepadding());
  }
  if (from.globalpooling() != 0) {
    set_globalpooling(from.globalpooling());
  }
  switch (from.PoolingPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case kIncludeLastPixel: {
      mutable_includelastpixel()->::CoreML::Specification::PoolingLayerParams_ValidCompletePadding::MergeFrom(from.includelastpixel());
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
}